

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O3

size_t ptls_asn1_read_length
                 (uint8_t *bytes,size_t bytes_max,size_t byte_index,uint32_t *length,
                 int *indefinite_length,size_t *last_byte,int *decode_error,int level,
                 ptls_minicrypto_log_ctx_t *log_ctx)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  size_t byte_index_00;
  uint uVar6;
  uint uVar7;
  
  *indefinite_length = 0;
  *length = 0;
  *last_byte = bytes_max;
  if (bytes_max <= byte_index) {
    return byte_index;
  }
  bVar2 = bytes[byte_index];
  uVar4 = (ulong)bVar2;
  byte_index_00 = byte_index + 1;
  *length = (uint)bVar2;
  if (-1 < (char)bVar2) goto LAB_0012245c;
  uVar5 = bVar2 & 0x7f;
  *length = 0;
  if (bytes_max <= byte_index_00 + uVar5) {
    ptls_asn1_error_message("Incorrect length coding",bytes_max,byte_index_00,level,log_ctx);
    iVar3 = 0x236;
    goto LAB_001224fb;
  }
  if (byte_index_00 < bytes_max && (bVar2 & 0x7f) != 0) {
    uVar7 = 0;
    uVar6 = 1;
    do {
      *length = uVar7 << 8;
      pbVar1 = bytes + byte_index_00;
      byte_index_00 = byte_index_00 + 1;
      uVar7 = (uint)*pbVar1 | uVar7 << 8;
      *length = uVar7;
      if (uVar5 <= uVar6) break;
      uVar6 = uVar6 + 1;
    } while (byte_index_00 < bytes_max);
    uVar4 = (ulong)uVar7;
LAB_0012245c:
    *last_byte = uVar4 + byte_index_00;
    uVar4 = uVar4 + byte_index_00;
  }
  else {
    if ((bVar2 & 0x7f) != 0) {
      uVar4 = 0;
      goto LAB_0012245c;
    }
    *last_byte = bytes_max;
    *indefinite_length = 1;
    uVar4 = bytes_max;
  }
  if (*decode_error != 0) {
    return byte_index_00;
  }
  if (uVar4 <= bytes_max) {
    return byte_index_00;
  }
  ptls_asn1_error_message("Length larger than message",bytes_max,byte_index_00,level,log_ctx);
  iVar3 = 0x237;
LAB_001224fb:
  *decode_error = iVar3;
  return byte_index_00;
}

Assistant:

size_t ptls_asn1_read_length(const uint8_t *bytes, size_t bytes_max, size_t byte_index, uint32_t *length, int *indefinite_length,
                             size_t *last_byte, int *decode_error, int level, ptls_minicrypto_log_ctx_t *log_ctx)
{
    int length_of_length = 0;

    *indefinite_length = 0;
    *length = 0;
    *last_byte = bytes_max;

    if (byte_index < bytes_max) {
        *length = bytes[byte_index++];
        if ((*length & 128) != 0) {
            length_of_length = *length & 127;
            *length = 0;

            if (byte_index + length_of_length >= bytes_max) {
                /* This is an error */
                byte_index = ptls_asn1_error_message("Incorrect length coding", bytes_max, byte_index, level, log_ctx);
                *decode_error = PTLS_ERROR_BER_MALFORMED_LENGTH;
            } else {
                for (int i = 0; i < length_of_length && byte_index < bytes_max; i++) {
                    *length <<= 8;
                    *length |= bytes[byte_index++];
                }

                if (length_of_length == 0) {
                    *last_byte = bytes_max;
                    *indefinite_length = 1;
                } else {
                    *last_byte = byte_index + *length;
                }
            }
        } else {
            *last_byte = byte_index + *length;
        }

        if (*decode_error == 0) {
            /* TODO: verify that the length makes sense */
            if (*last_byte > bytes_max) {
                byte_index = ptls_asn1_error_message("Length larger than message", bytes_max, byte_index, level, log_ctx);
                *decode_error = PTLS_ERROR_BER_EXCESSIVE_LENGTH;
            }
        }
    }

    return byte_index;
}